

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *root;
  long lVar4;
  ArrayIndex index;
  string local_70;
  string *local_50;
  pointer local_48;
  pointer local_40;
  Value *local_38;
  
  AVar3 = Value::size(value);
  if (AVar3 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[]","");
    pushValue(this,&local_70);
  }
  else {
    bVar2 = isMultineArray(this,value);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(this->document_,"[ ",2);
      lVar4 = 0;
      do {
        if (lVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->document_,", ",2);
        }
        pbVar1 = (this->childValues_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->document_,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),
                   *(long *)((long)&pbVar1->_M_string_length + lVar4));
        lVar4 = lVar4 + 0x20;
      } while ((ulong)AVar3 << 5 != lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(this->document_," ]",2);
      return;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
    writeIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->document_,local_70._M_dataplus._M_p,local_70._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_50 = &this->indentString_;
    std::__cxx11::string::_M_append((char *)local_50,(ulong)(this->indentation_)._M_dataplus._M_p);
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = 8;
    index = 0;
    local_38 = value;
    do {
      root = Value::operator[](local_38,index);
      writeCommentBeforeValue(this,root);
      if (local_40 == local_48) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        pbVar1 = (this->childValues_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        writeIndent(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->document_,*(char **)((long)pbVar1 + lVar4 + -8),
                   *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      }
      if (index - AVar3 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,",",1);
      }
      writeCommentAfterValueOnSameLine(this,root);
      lVar4 = lVar4 + 0x20;
      index = index + 1;
    } while (index != AVar3);
    std::__cxx11::string::resize
              ((ulong)local_50,
               (char)(this->indentString_)._M_string_length -
               (char)(this->indentation_)._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"]","");
    writeIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->document_,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}